

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_int_&,_const_int_&> * __thiscall
Catch::ExprLhs<int_const&>::operator==(ExprLhs<const_int_&> *this,int *rhs)

{
  undefined1 uVar1;
  int *in_RDX;
  StringRef *in_RSI;
  BinaryExpr<const_int_&,_const_int_&> *in_RDI;
  undefined7 in_stack_ffffffffffffffa0;
  BinaryExpr<const_int_&,_const_int_&> *pBVar2;
  undefined1 comparisonResult;
  
  pBVar2 = in_RDI;
  uVar1 = compareEqual<int,int>((int *)in_RSI->m_start,in_RDX);
  comparisonResult = (undefined1)((ulong)pBVar2 >> 0x38);
  pBVar2 = (BinaryExpr<const_int_&,_const_int_&> *)in_RSI->m_start;
  StringRef::StringRef((StringRef *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),(char *)in_RSI);
  BinaryExpr<const_int_&,_const_int_&>::BinaryExpr
            (pBVar2,(bool)comparisonResult,(int *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),in_RSI,
             (int *)in_RDI);
  StringRef::~StringRef((StringRef *)in_RDI);
  return in_RDI;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }